

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_base_cancel_single_callback_(event_base *base,event_callback *evcb,int run_finalizers)

{
  int iVar1;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar2;
  void *extraout_RDX_03;
  void *extraout_RDX;
  
  if ((evcb->evcb_flags & 0x80) == 0) {
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    iVar1 = 1;
    event_callback_cancel_nolock_(base,evcb,1);
    pvVar2 = extraout_RDX;
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      pvVar2 = extraout_RDX_00;
    }
  }
  else {
    event_callback_to_event(evcb);
    iVar1 = 0;
    pvVar2 = extraout_RDX_01;
    if ((evcb->evcb_flags & 0x10) == 0) {
      event_del_((event *)evcb,3);
      iVar1 = 1;
      pvVar2 = extraout_RDX_02;
    }
  }
  if ((run_finalizers != 0) && ((evcb->evcb_flags & 0x40) != 0)) {
    if (evcb->evcb_closure - 5 < 2) {
      event_callback_to_event(evcb);
      (*(evcb->evcb_cb_union).evcb_callback)((int)evcb,(short)evcb->evcb_arg,extraout_RDX_03);
      if (evcb->evcb_closure == '\x06') {
        event_mm_free_(evcb);
      }
    }
    else if (evcb->evcb_closure == 4) {
      (*(evcb->evcb_cb_union).evcb_callback)((int)evcb,(short)evcb->evcb_arg,pvVar2);
    }
  }
  return iVar1;
}

Assistant:

static int
event_base_cancel_single_callback_(struct event_base *base,
    struct event_callback *evcb,
    int run_finalizers)
{
	int result = 0;

	if (evcb->evcb_flags & EVLIST_INIT) {
		struct event *ev = event_callback_to_event(evcb);
		if (!(ev->ev_flags & EVLIST_INTERNAL)) {
			event_del_(ev, EVENT_DEL_EVEN_IF_FINALIZING);
			result = 1;
		}
	} else {
		EVBASE_ACQUIRE_LOCK(base, th_base_lock);
		event_callback_cancel_nolock_(base, evcb, 1);
		EVBASE_RELEASE_LOCK(base, th_base_lock);
		result = 1;
	}

	if (run_finalizers && (evcb->evcb_flags & EVLIST_FINALIZING)) {
		switch (evcb->evcb_closure) {
		case EV_CLOSURE_EVENT_FINALIZE:
		case EV_CLOSURE_EVENT_FINALIZE_FREE: {
			struct event *ev = event_callback_to_event(evcb);
			ev->ev_evcallback.evcb_cb_union.evcb_evfinalize(ev, ev->ev_arg);
			if (evcb->evcb_closure == EV_CLOSURE_EVENT_FINALIZE_FREE)
				mm_free(ev);
			break;
		}
		case EV_CLOSURE_CB_FINALIZE:
			evcb->evcb_cb_union.evcb_cbfinalize(evcb, evcb->evcb_arg);
			break;
		default:
			break;
		}
	}
	return result;
}